

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O1

wchar_t effect_calculate_value(effect_handler_context_t_conflict *context,_Bool use_boost)

{
  int iVar1;
  int iVar2;
  wchar_t wVar3;
  
  if (set_value == L'\0') {
    iVar1 = (context->value).base;
    if ((0 < iVar1) || ((wVar3 = L'\0', 0 < (context->value).dice && (0 < (context->value).sides))))
    {
      iVar2 = damroll((context->value).dice,(context->value).sides);
      wVar3 = iVar2 + iVar1;
    }
    if (use_boost) {
      wVar3 = ((context->boost + 100) * wVar3) / 100;
    }
    return wVar3;
  }
  return set_value;
}

Assistant:

int effect_calculate_value(effect_handler_context_t *context, bool use_boost)
{
	int final = 0;

	if (set_value) {
		return set_value;
	}

	if (context->value.base > 0 ||
		(context->value.dice > 0 && context->value.sides > 0)) {
		final = context->value.base +
			damroll(context->value.dice, context->value.sides);
	}

	/* Device boost */
	if (use_boost) {
		final *= (100 + context->boost);
		final /= 100;
	}

	return final;
}